

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O2

void __thiscall NPC::Killed(NPC *this,Character *from,int amount,int spell_id)

{
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_00;
  byte bVar1;
  World *pWVar2;
  pointer puVar3;
  EIF *pEVar4;
  Character *this_01;
  Party *this_02;
  pointer ppNVar5;
  NPC *this_03;
  Map *pMVar6;
  PacketFamily family;
  double dVar7;
  double dVar8;
  pointer ppNVar9;
  bool bVar10;
  uint uVar11;
  int sharemode;
  int iVar12;
  int iVar13;
  mapped_type *pmVar14;
  NPC_Data *pNVar15;
  ENF_Data *pEVar16;
  _Base_ptr p_Var17;
  _List_iterator<NPC_*> __first;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> __first_00;
  Quest *this_04;
  pointer puVar18;
  _List_node_base *p_Var19;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> *checkdrop;
  NPC_Drop *pNVar20;
  pointer ppNVar21;
  pointer ppNVar22;
  list<Character_*,_std::allocator<Character_*>_> *plVar23;
  _List_iterator<NPC_*> __last;
  short sVar24;
  _List_node_base *p_Var25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  int dropamount;
  int dropid;
  int dropuid;
  allocator<char> local_109;
  vector<NPC_Drop_*,_std::allocator<NPC_Drop_*>_> drops;
  set<Party_*,_std::less<Party_*>,_std::allocator<Party_*>_> parties;
  shared_ptr<Map_Item> newitem;
  int local_64;
  ulong local_60;
  _List_node_base *local_58;
  Character *local_50;
  _List_node_base *local_48;
  double local_40;
  _List_node_base *local_38;
  
  pWVar2 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parties,"DropRate",(allocator<char> *)&drops);
  pmVar14 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&parties);
  dVar7 = util::variant::GetFloat(pmVar14);
  std::__cxx11::string::~string((string *)&parties);
  pWVar2 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parties,"ExpRate",(allocator<char> *)&drops);
  pmVar14 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&parties);
  util::variant::GetFloat(pmVar14);
  std::__cxx11::string::~string((string *)&parties);
  pWVar2 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parties,"ShareMode",(allocator<char> *)&drops);
  pmVar14 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&parties);
  uVar11 = util::variant::GetInt(pmVar14);
  std::__cxx11::string::~string((string *)&parties);
  pWVar2 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parties,"PartyShareMode",(allocator<char> *)&drops);
  pmVar14 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&parties);
  sharemode = util::variant::GetInt(pmVar14);
  std::__cxx11::string::~string((string *)&parties);
  pWVar2 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parties,"DropRateMode",(allocator<char> *)&drops);
  pmVar14 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&parties);
  iVar12 = util::variant::GetInt(pmVar14);
  std::__cxx11::string::~string((string *)&parties);
  parties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parties._M_t._M_impl.super__Rb_tree_header._M_header;
  parties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->alive = false;
  parties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  dVar8 = Timer::GetTime();
  this->dead_since = (double)(int)dVar8;
  if (iVar12 == 3) {
    Data(this);
    util::rand();
    pNVar15 = Data(this);
    for (puVar18 = (pNVar15->drops).
                   super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar18 !=
        (pNVar15->drops).
        super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      pNVar20 = (puVar18->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t
                .super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
      if ((pNVar20->chance_offset <= (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) &&
         ((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) <
          pNVar20->chance_offset + pNVar20->chance)) goto LAB_0016204a;
    }
  }
  else {
    if (iVar12 == 2) {
      pNVar15 = Data(this);
      puVar18 = (pNVar15->drops).
                super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (pNVar15->drops).
               super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (puVar18 == puVar3) goto LAB_00162014;
        util::rand();
        pNVar20 = (puVar18->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                  _M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                  super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
        puVar18 = puVar18 + 1;
      } while (pNVar20->chance * dVar7 < (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      goto LAB_0016204a;
    }
    if (iVar12 == 1) {
      drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar15 = Data(this);
      puVar3 = (pNVar15->drops).
               super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar18 = (pNVar15->drops).
                     super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar3;
          puVar18 = puVar18 + 1) {
        util::rand();
        pNVar20 = (puVar18->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                  _M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                  super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
        if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= pNVar20->chance * dVar7) {
          newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pNVar20;
          std::vector<NPC_Drop*,std::allocator<NPC_Drop*>>::emplace_back<NPC_Drop*>
                    ((vector<NPC_Drop*,std::allocator<NPC_Drop*>> *)&drops,(NPC_Drop **)&newitem);
        }
      }
      if (drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pNVar20 = (NPC_Drop *)0x0;
      }
      else {
        iVar12 = util::rand();
        pNVar20 = drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar12];
      }
      std::_Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>::~_Vector_base
                (&drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>);
      goto LAB_0016204a;
    }
  }
LAB_00162014:
  pNVar20 = (NPC_Drop *)0x0;
LAB_0016204a:
  if (uVar11 == 1) {
    p_Var19 = (_List_node_base *)&this->damagelist;
    iVar12 = 0;
    while (p_Var19 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                        *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var19 != (_List_node_base *)&this->damagelist) {
      iVar13 = *(int *)((long)p_Var19[1]._M_next + 8);
      if (iVar12 < iVar13) {
        iVar12 = iVar13;
      }
    }
  }
  dropuid = 0;
  dropid = 0;
  dropamount = 0;
  local_60 = (ulong)uVar11;
  if (pNVar20 != (NPC_Drop *)0x0) {
    dropid = (int)pNVar20->id;
    iVar12 = util::rand();
    pWVar2 = this->map->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drops,"MaxItem",(allocator<char> *)&newitem);
    pmVar14 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar2->config,(key_type *)&drops);
    iVar13 = util::variant::GetInt(pmVar14);
    dropamount = iVar12;
    if (iVar13 < iVar12) {
      dropamount = iVar13;
    }
    std::__cxx11::string::~string((string *)&drops);
    if (((0 < (long)dropid) &&
        (pEVar4 = this->map->world->eif,
        (ulong)(long)dropid <
        (ulong)(((long)(pEVar4->data).
                       super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar4->data).
                      super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x70))) && (0 < dropamount)) {
      dropuid = Map::GenerateItemID(this->map);
      local_64 = Character::PlayerID(from);
      dVar7 = Timer::GetTime();
      pWVar2 = this->map->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&drops,"ProtectNPCDrop",&local_109);
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar2->config,(key_type *)&drops);
      iVar12 = util::variant::GetInt(pmVar14);
      local_40 = dVar7 + (double)iVar12;
      std::make_shared<Map_Item,int&,int&,int&,unsigned_char&,unsigned_char&,int,double>
                ((int *)&newitem,&dropuid,&dropid,(uchar *)&dropamount,&this->x,(int *)&this->y,
                 (double *)&local_64);
      std::__cxx11::string::~string((string *)&drops);
      std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
      push_back(&this->map->items,&newitem);
      if (uVar11 < 4) {
        (*(code *)(&DAT_00185b30 + *(int *)(&DAT_00185b30 + local_60 * 4)))();
        return;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  local_48 = (_List_node_base *)&this->map->characters;
  this_00 = &this->damagelist;
  family = PACKET_CAST;
  if (spell_id == -1) {
    family = PACKET_NPC;
  }
  local_50 = from;
  local_38 = local_48;
LAB_001623b7:
  do {
    p_Var19 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&local_48->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var19 == local_38) {
      for (p_Var17 = parties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var17 != &parties._M_t._M_impl.super__Rb_tree_header;
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
        this_02 = *(Party **)(p_Var17 + 1);
        Party::ShareEXP(this_02,this_02->temp_expsum,sharemode,this->map);
        this_02->temp_expsum = 0;
      }
      p_Var19 = (_List_node_base *)this_00;
      while (p_Var19 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                          *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var19 != (_List_node_base *)this_00) {
        __last._M_node = (_List_node_base *)(*(long *)p_Var19[1]._M_next + 0x378);
        drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this;
        __first = std::
                  __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                            (*(_List_node_base **)(*(long *)p_Var19[1]._M_next + 0x378),__last,
                             (_Iter_equals_val<NPC_*const>)&drops);
        std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                  ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,
                   (const_iterator)__first._M_node,
                   (_List_node_base *)(*(long *)p_Var19[1]._M_next + 0x378));
      }
      std::__cxx11::
      list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
      ::clear(this_00);
      this->totaldamage = 0;
      pEVar16 = ENF(this);
      if (pEVar16->boss != 0) {
        drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppNVar5 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppNVar21 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
            ppNVar9 = drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
                      super__Vector_impl_data._M_finish, ppNVar21 != ppNVar5;
            ppNVar21 = ppNVar21 + 1) {
          newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*ppNVar21;
          pEVar16 = ENF((NPC *)newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
          if (((pEVar16->child != 0) &&
              (pEVar16 = ENF((NPC *)newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr), pEVar16->boss == 0)) &&
             (*(char *)&(newitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        unprotecttime == '\x01')) {
            std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                      ((vector<NPC_*,_std::allocator<NPC_*>_> *)&drops,(value_type *)&newitem);
          }
        }
        sVar24 = -1;
        for (ppNVar22 = drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
                        super__Vector_impl_data._M_start; ppNVar22 != ppNVar9;
            ppNVar22 = ppNVar22 + 1) {
          this_03 = (NPC *)*ppNVar22;
          if ((this_03->temporary == false) && ((sVar24 == -1 || (this_03->id == (int)sVar24)))) {
            Die(this_03,false);
            sVar24 = (short)this_03->id;
          }
          else {
            Die(this_03,true);
          }
        }
        std::_Vector_base<NPC_*,_std::allocator<NPC_*>_>::~_Vector_base
                  ((_Vector_base<NPC_*,_std::allocator<NPC_*>_> *)&drops);
        if (sVar24 != -1) {
          PacketBuilder::PacketBuilder((PacketBuilder *)&drops,PACKET_NPC,PACKET_JUNK,2);
          PacketBuilder::AddShort((PacketBuilder *)&drops,(int)sVar24);
          plVar23 = &this->map->characters;
          p_Var19 = (_List_node_base *)plVar23;
          while (p_Var19 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)
                            &p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var19 != (_List_node_base *)plVar23) {
            Character::Send((Character *)p_Var19[1]._M_next,(PacketBuilder *)&drops);
          }
          PacketBuilder::~PacketBuilder((PacketBuilder *)&drops);
        }
      }
      if (this->temporary == true) {
        pMVar6 = this->map;
        drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this;
        __first_00 = std::
                     __remove_if<__gnu_cxx::__normal_iterator<NPC**,std::vector<NPC*,std::allocator<NPC*>>>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                               ((__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                 )(pMVar6->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                 )(pMVar6->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish,
                                (_Iter_equals_val<NPC_*const>)&drops);
        std::vector<NPC_*,_std::allocator<NPC_*>_>::erase
                  (&pMVar6->npcs,(const_iterator)__first_00._M_current,
                   (const_iterator)
                   (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      for (p_Var17 = (from->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var17 != &(from->quests)._M_t._M_impl.super__Rb_tree_header;
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
        std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
                  ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)&drops,
                   (pair<const_short,_std::shared_ptr<Quest_Context>_> *)(p_Var17 + 1));
        if (drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          this_04 = Quest_Context::GetQuest
                              ((Quest_Context *)
                               drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          bVar10 = Quest::Disabled(this_04);
          ppNVar9 = drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (!bVar10) {
            pEVar16 = ENF(this);
            Quest_Context::KilledNPC((Quest_Context *)ppNVar9,(short)pEVar16->id);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &drops.super__Vector_base<NPC_Drop_*,_std::allocator<NPC_Drop_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      if (this->temporary != false) {
        ~NPC(this);
        operator_delete(this,0x70);
      }
      std::
      _Rb_tree<Party_*,_Party_*,_std::_Identity<Party_*>,_std::less<Party_*>,_std::allocator<Party_*>_>
      ::~_Rb_tree(&parties._M_t);
      return;
    }
    this_01 = (Character *)p_Var19[1]._M_next;
    p_Var25 = (_List_node_base *)this_00;
    do {
      p_Var25 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                   *)&p_Var25->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_48 = p_Var19;
      if (p_Var25 == (_List_node_base *)this_00) {
        bVar10 = Character::InRange(this_01,this);
        if (!bVar10) goto LAB_001623b7;
        break;
      }
    } while (*(Character **)p_Var25[1]._M_next != this_01);
    PacketBuilder::PacketBuilder((PacketBuilder *)&drops,family,PACKET_SPEC,0x1a);
    pEVar16 = ENF(this);
    bVar10 = false;
    if ((p_Var25 != (_List_node_base *)this_00) && (bVar10 = false, pEVar16->exp != 0)) {
      if (uVar11 < 4) {
        (*(code *)(&DAT_00185b40 + *(int *)(&DAT_00185b40 + local_60 * 4)))();
        return;
      }
      pWVar2 = this->map->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&newitem,"MaxExp",(allocator<char> *)&local_40);
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar2->config,(key_type *)&newitem);
      iVar13 = util::variant::GetInt(pmVar14);
      iVar12 = this_01->exp;
      if (iVar13 < this_01->exp) {
        iVar12 = iVar13;
      }
      this_01->exp = iVar12;
      std::__cxx11::string::~string((string *)&newitem);
      bVar10 = false;
      local_58 = p_Var25;
      while( true ) {
        bVar1 = this_01->level;
        pWVar2 = this->map->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newitem,"MaxLevel",(allocator<char> *)&local_40);
        pmVar14 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar2->config,(key_type *)&newitem);
        iVar12 = util::variant::GetInt(pmVar14);
        if (iVar12 <= (int)(uint)bVar1) break;
        iVar12 = this_01->exp;
        iVar13 = (this->map->world->exp_table)._M_elems[(ulong)this_01->level + 1];
        std::__cxx11::string::~string((string *)&newitem);
        if (iVar12 < iVar13) goto LAB_00162765;
        this_01->level = this_01->level + '\x01';
        pWVar2 = this->map->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newitem,"StatPerLevel",(allocator<char> *)&local_40);
        pmVar14 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar2->config,(key_type *)&newitem);
        iVar12 = util::variant::GetInt(pmVar14);
        this_01->statpoints = this_01->statpoints + iVar12;
        std::__cxx11::string::~string((string *)&newitem);
        pWVar2 = this->map->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newitem,"SkillPerLevel",(allocator<char> *)&local_40);
        pmVar14 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar2->config,(key_type *)&newitem);
        iVar12 = util::variant::GetInt(pmVar14);
        this_01->skillpoints = this_01->skillpoints + iVar12;
        std::__cxx11::string::~string((string *)&newitem);
        bVar10 = true;
        Character::CalculateStats(this_01,true);
      }
      std::__cxx11::string::~string((string *)&newitem);
LAB_00162765:
      if (bVar10) {
        PacketBuilder::SetID((PacketBuilder *)&drops,family,PACKET_ACCEPT);
        p_Var25 = local_58;
        bVar10 = true;
        PacketBuilder::ReserveMore((PacketBuilder *)&drops,0x21);
      }
      else {
        bVar10 = false;
        p_Var25 = local_58;
      }
    }
    if (spell_id != -1) {
      PacketBuilder::AddShort((PacketBuilder *)&drops,spell_id);
    }
    iVar12 = Character::PlayerID(local_50);
    PacketBuilder::AddShort((PacketBuilder *)&drops,iVar12);
    PacketBuilder::AddChar((PacketBuilder *)&drops,(uint)local_50->direction);
    PacketBuilder::AddShort((PacketBuilder *)&drops,(uint)this->index);
    PacketBuilder::AddShort((PacketBuilder *)&drops,dropuid);
    PacketBuilder::AddShort((PacketBuilder *)&drops,dropid);
    PacketBuilder::AddChar((PacketBuilder *)&drops,(uint)this->x);
    PacketBuilder::AddChar((PacketBuilder *)&drops,(uint)this->y);
    PacketBuilder::AddInt((PacketBuilder *)&drops,dropamount);
    PacketBuilder::AddThree((PacketBuilder *)&drops,amount);
    if (spell_id != -1) {
      PacketBuilder::AddShort((PacketBuilder *)&drops,from->tp);
    }
    if ((this_01 == from && uVar11 == 0) || (uVar11 != 0 && p_Var25 != (_List_node_base *)this_00))
    {
      PacketBuilder::AddInt((PacketBuilder *)&drops,this_01->exp);
    }
    if (bVar10) {
      PacketBuilder::AddChar((PacketBuilder *)&drops,(uint)this_01->level);
      PacketBuilder::AddShort((PacketBuilder *)&drops,this_01->statpoints);
      PacketBuilder::AddShort((PacketBuilder *)&drops,this_01->skillpoints);
      PacketBuilder::AddShort((PacketBuilder *)&drops,this_01->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)&drops,this_01->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)&drops,this_01->maxsp);
    }
    Character::Send(this_01,(PacketBuilder *)&drops);
    PacketBuilder::~PacketBuilder((PacketBuilder *)&drops);
  } while( true );
}

Assistant:

void NPC::Killed(Character *from, int amount, int spell_id)
{
	double droprate = this->map->world->config["DropRate"];
	double exprate = this->map->world->config["ExpRate"];
	int sharemode = this->map->world->config["ShareMode"];
	int partysharemode = this->map->world->config["PartyShareMode"];
	int dropratemode = this->map->world->config["DropRateMode"];
	std::set<Party *> parties;

	int most_damage_counter = 0;
	Character *most_damage = nullptr;
	NPC_Drop *drop = nullptr;

	this->alive = false;

	this->dead_since = int(Timer::GetTime());

	if (dropratemode == 1)
	{
		std::vector<NPC_Drop *> drops;

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drops.push_back(checkdrop.get());
			}
		}

		if (drops.size() > 0)
		{
			drop = drops[util::rand(0, drops.size()-1)];
		}
	}
	else if (dropratemode == 2)
	{
		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (util::rand(0.0, 100.0) <= checkdrop->chance * droprate)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}
	else if (dropratemode == 3)
	{
		double roll = util::rand(0.0, this->Data().drops_chance_total);

		UTIL_FOREACH_CREF(this->Data().drops, checkdrop)
		{
			if (roll >= checkdrop->chance_offset && roll < checkdrop->chance_offset+checkdrop->chance)
			{
				drop = checkdrop.get();
				break;
			}
		}
	}

	if (sharemode == 1)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->damage > most_damage_counter)
			{
				most_damage_counter = opponent->damage;
				most_damage = opponent->attacker;
			}
		}
	}

	int dropuid = 0;
	int dropid = 0;
	int dropamount = 0;
	Character* drop_winner = nullptr;

	if (drop)
	{
		dropid = drop->id;
		dropamount = std::min<int>(util::rand(drop->min, drop->max), this->map->world->config["MaxItem"]);

		if (dropid <= 0 || static_cast<std::size_t>(dropid) >= this->map->world->eif->data.size() || dropamount <= 0)
			goto abort_drop;

		dropuid = this->map->GenerateItemID();

		std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(dropuid, dropid, dropamount, this->x, this->y, from->PlayerID(), Timer::GetTime() + static_cast<int>(this->map->world->config["ProtectNPCDrop"])));
		this->map->items.push_back(newitem);

		// Selects a random number between 0 and maxhp, and decides the winner based on that
		switch (sharemode)
		{
			case 0:
				drop_winner = from;
				break;

			case 1:
				drop_winner = most_damage;
				break;

			case 2:
			{
				int rewarded_hp = util::rand(0, this->totaldamage - 1);
				int count_hp = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rewarded_hp >= count_hp && rewarded_hp < opponent->damage)
						{
							drop_winner = opponent->attacker;
							break;
						}

						count_hp += opponent->damage;
					}
				}
			}
				break;

			case 3:
			{
				int rand = util::rand(0, this->damagelist.size() - 1);
				int i = 0;
				UTIL_FOREACH_CREF(this->damagelist, opponent)
				{
					if (opponent->attacker->InRange(this))
					{
						if (rand == i++)
						{
							drop_winner = opponent->attacker;
							break;
						}
					}
				}
			}
				break;
		}
	}
	abort_drop:

	if (drop_winner)
		this->map->items.back()->owner = drop_winner->PlayerID();

	UTIL_FOREACH(this->map->characters, character)
	{
		std::list<std::unique_ptr<NPC_Opponent>>::iterator findopp = this->damagelist.begin();
		for (; findopp != this->damagelist.end() && (*findopp)->attacker != character; ++findopp); // no loop body

		if (findopp != this->damagelist.end() || character->InRange(this))
		{
			bool level_up = false;

			PacketBuilder builder(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_SPEC, 26);

			if (this->ENF().exp != 0)
			{
				if (findopp != this->damagelist.end())
				{
					int reward;
					switch (sharemode)
					{
						case 0:
							if (character == from)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 1:
							if (character == most_damage)
							{
								reward = int(std::ceil(double(this->ENF().exp) * exprate));

								if (reward > 0)
								{
									if (partysharemode)
									{
										if (character->party)
										{
											character->party->ShareEXP(reward, partysharemode, this->map);
										}
										else
										{
											character->exp += reward;
										}
									}
									else
									{
										character->exp += reward;
									}
								}
							}
							break;

						case 2:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double((*findopp)->damage) / double(this->totaldamage))));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
										parties.insert(character->party);
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;

						case 3:
							reward = int(std::ceil(double(this->ENF().exp) * exprate * (double(this->damagelist.size()) / 1.0)));

							if (reward > 0)
							{
								if (partysharemode)
								{
									if (character->party)
									{
										character->party->temp_expsum += reward;
									}
									else
									{
										character->exp += reward;
									}
								}
								else
								{
									character->exp += reward;
								}
							}
							break;
					}

					character->exp = std::min(character->exp, static_cast<int>(this->map->world->config["MaxExp"]));

					while (character->level < static_cast<int>(this->map->world->config["MaxLevel"]) && character->exp >= this->map->world->exp_table[character->level+1])
					{
						level_up = true;
						++character->level;
						character->statpoints += static_cast<int>(this->map->world->config["StatPerLevel"]);
						character->skillpoints += static_cast<int>(this->map->world->config["SkillPerLevel"]);
						character->CalculateStats();
					}

					if (level_up)
					{
						builder.SetID(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_ACCEPT);
						builder.ReserveMore(33);
					}
				}
			}

			if (spell_id != -1)
				builder.AddShort(spell_id);

			builder.AddShort(drop_winner ? drop_winner->PlayerID() : from->PlayerID());
			builder.AddChar(drop_winner ? drop_winner->direction : from->direction);
			builder.AddShort(this->index);
			builder.AddShort(dropuid);
			builder.AddShort(dropid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddInt(dropamount);
			builder.AddThree(amount);

			if (spell_id != -1)
				builder.AddShort(from->tp);

			if ((sharemode == 0 && character == from) || (sharemode != 0 && findopp != this->damagelist.end()))
			{
				builder.AddInt(character->exp);
			}

			if (level_up)
			{
				builder.AddChar(character->level);
				builder.AddShort(character->statpoints);
				builder.AddShort(character->skillpoints);
				builder.AddShort(character->maxhp);
				builder.AddShort(character->maxtp);
				builder.AddShort(character->maxsp);
			}

			character->Send(builder);
		}
	}

	UTIL_FOREACH(parties, party)
	{
		party->ShareEXP(party->temp_expsum, partysharemode, this->map);
		party->temp_expsum = 0;
	}

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}

	this->damagelist.clear();
	this->totaldamage = 0;

	short childid = -1;

	if (this->ENF().boss)
	{
		std::vector<NPC*> child_npcs;

		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child && !npc->ENF().boss && npc->alive)
			{
				child_npcs.push_back(npc);
			}
		}

		UTIL_FOREACH(child_npcs, npc)
		{
			if (!npc->temporary && (childid == -1 || childid == npc->id))
			{
				npc->Die(false);
				childid = npc->id;
			}
			else
			{
				npc->Die(true);
			}
		}
	}

	if (childid != -1)
	{
		PacketBuilder builder(PACKET_NPC, PACKET_JUNK, 2);
		builder.AddShort(childid);

		UTIL_FOREACH(this->map->characters, character)
		{
			character->Send(builder);
		}
	}

	if (this->temporary)
	{
		this->map->npcs.erase(
			std::remove(this->map->npcs.begin(), this->map->npcs.end(), this),
			this->map->npcs.end()
		);
	}

	UTIL_FOREACH(from->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->KilledNPC(this->ENF().id);
	}

	if (this->temporary)
	{
		delete this;
		return;
	}
}